

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O3

mz_bool mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  mz_uint32 mVar4;
  mz_zip_error mVar5;
  size_t sVar6;
  mz_uint8 *ptr;
  mz_uint8 *pOut_buf_start;
  size_t sVar7;
  undefined4 extraout_var;
  size_t sVar9;
  mz_uint64 mVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  mz_uint8 *pOut_buf_next;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  ulong local_25d0;
  mz_uint64 local_25b8;
  ulong local_25a0;
  size_t local_2588;
  size_t local_2580;
  size_t local_2578;
  undefined8 local_2570;
  int local_2568 [6];
  ushort local_254e;
  ushort local_254c;
  mz_zip_archive_file_stat local_2540;
  tinfl_decompressor local_20e8;
  undefined8 uVar8;
  mz_ulong mVar10;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (((pCallback == (mz_file_write_func)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0))
     || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2540);
  if (mVar2 == 0) {
    return 0;
  }
  if (local_2540.m_is_directory != 0) {
    return 1;
  }
  if (local_2540.m_comp_size == 0) {
    return 1;
  }
  if (((byte)local_2540.m_bit_flag & 0x61) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((local_2540.m_method & 0xfff7) != 0)) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  sVar6 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2540.m_local_header_ofs,local_2568,0x1e);
  if (sVar6 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_2568[0] != 0x4034b50) {
LAB_00109360:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  if (pZip->m_archive_size <
      local_2540.m_local_header_ofs + local_254e + (ulong)local_254c + local_2540.m_comp_size + 0x1e
     ) goto LAB_00109360;
  local_25b8 = local_2540.m_local_header_ofs + local_254e + (ulong)local_254c + 0x1e;
  pvVar1 = pZip->m_pState->m_pMem;
  if (pvVar1 == (void *)0x0) {
    local_25a0 = 0x10000;
    if (local_2540.m_comp_size < 0x10000) {
      local_25a0 = local_2540.m_comp_size;
    }
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,local_25a0);
    if (ptr == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    mVar11 = 0;
    uVar13 = local_2540.m_comp_size;
  }
  else {
    ptr = (mz_uint8 *)((long)pvVar1 + local_25b8);
    local_25a0 = local_2540.m_comp_size;
    uVar13 = 0;
    mVar11 = local_2540.m_comp_size;
  }
  if (((flags >> 10 & 1) == 0) && (local_2540.m_method != 0)) {
    local_20e8.m_state = 0;
    pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    else {
      local_25d0 = 0;
      lVar12 = 0;
      sVar6 = 0;
      do {
        uVar14 = (ulong)((uint)sVar6 & 0x7fff);
        local_2588 = 0x8000 - uVar14;
        if (mVar11 == 0) {
          if (pZip->m_pState->m_pMem != (void *)0x0) {
            mVar11 = 0;
            goto LAB_001094c4;
          }
          mVar11 = uVar13;
          if (local_25a0 < uVar13) {
            mVar11 = local_25a0;
          }
          sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_25b8,ptr,mVar11);
          if (sVar7 == mVar11) {
            local_25b8 = local_25b8 + mVar11;
            uVar13 = uVar13 - mVar11;
            lVar12 = 0;
            goto LAB_001094c4;
          }
          mVar5 = MZ_ZIP_FILE_READ_FAILED;
LAB_00109708:
          pZip->m_last_error = mVar5;
          goto LAB_0010976f;
        }
LAB_001094c4:
        pOut_buf_next = pOut_buf_start + uVar14;
        local_2580 = mVar11;
        tVar3 = tinfl_decompress(&local_20e8,ptr + lVar12,&local_2580,pOut_buf_start,pOut_buf_next,
                                 &local_2588,(uint)(uVar13 != 0) * 2);
        sVar7 = local_2588;
        uVar8 = CONCAT44(extraout_var,tVar3);
        sVar9 = local_2580;
        if (local_2588 != 0) {
          local_2578 = local_2580;
          local_2570 = uVar8;
          sVar9 = (*pCallback)(pOpaque,sVar6,pOut_buf_next,local_2588);
          if (sVar9 == sVar7) {
            local_25d0 = mz_crc32(local_25d0 & 0xffffffff,pOut_buf_next,sVar7);
            sVar6 = sVar6 + sVar7;
            uVar8 = local_2570;
            sVar9 = local_2578;
            if (sVar6 <= local_2540.m_uncomp_size) goto LAB_001095a6;
            mVar5 = MZ_ZIP_DECOMPRESSION_FAILED;
          }
          else {
            mVar5 = MZ_ZIP_WRITE_CALLBACK_FAILED;
          }
          goto LAB_00109708;
        }
LAB_001095a6:
        mVar11 = mVar11 - sVar9;
        lVar12 = lVar12 + sVar9;
      } while ((int)uVar8 - 1U < 2);
      mVar2 = 0;
      mVar4 = (mz_uint32)local_25d0;
      if ((int)uVar8 != 0) goto LAB_00109772;
LAB_00109725:
      mVar2 = 1;
      if ((flags >> 10 & 1) != 0) goto LAB_00109772;
LAB_00109731:
      if (sVar6 == local_2540.m_uncomp_size) {
        mVar2 = 1;
        if (mVar4 == local_2540.m_crc32) goto LAB_00109772;
        pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
      }
      else {
        pZip->m_last_error = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
      }
    }
LAB_0010976f:
    mVar2 = 0;
  }
  else {
    if (pZip->m_pState->m_pMem == (void *)0x0) {
      if (uVar13 == 0) {
        pOut_buf_start = (mz_uint8 *)0x0;
        sVar6 = 0;
        mVar4 = 0;
      }
      else {
        sVar6 = 0;
        local_25d0 = 0;
        do {
          uVar14 = uVar13;
          if (local_25a0 < uVar13) {
            uVar14 = local_25a0;
          }
          sVar7 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_25b8,ptr,uVar14);
          if (sVar7 != uVar14) {
            pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_0010976c:
            pOut_buf_start = (mz_uint8 *)0x0;
            goto LAB_0010976f;
          }
          if ((flags >> 10 & 1) == 0) {
            local_25d0 = mz_crc32(local_25d0 & 0xffffffff,ptr,uVar14);
          }
          sVar7 = (*pCallback)(pOpaque,sVar6,ptr,uVar14);
          if (sVar7 != uVar14) {
            pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
            goto LAB_0010976c;
          }
          local_25b8 = local_25b8 + uVar14;
          sVar6 = sVar6 + uVar14;
          uVar13 = uVar13 - uVar14;
        } while (uVar13 != 0);
        pOut_buf_start = (mz_uint8 *)0x0;
        mVar4 = (mz_uint32)local_25d0;
      }
      goto LAB_00109725;
    }
    mVar2 = 0;
    sVar6 = (*pCallback)(pOpaque,0,ptr,local_2540.m_comp_size);
    if (sVar6 == local_2540.m_comp_size) {
      if ((flags >> 10 & 1) == 0) {
        pOut_buf_start = (mz_uint8 *)0x0;
        mVar10 = mz_crc32(0,ptr,sVar6);
        mVar4 = (mz_uint32)mVar10;
        goto LAB_00109731;
      }
      mVar2 = 1;
    }
    else {
      pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
    }
    pOut_buf_start = (mz_uint8 *)0x0;
  }
LAB_00109772:
  if (pZip->m_pState->m_pMem == (void *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
  }
  if (pOut_buf_start != (mz_uint8 *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
    return mVar2;
  }
  return mVar2;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip,
                                          mz_uint file_index,
                                          mz_file_write_func pCallback,
                                          void *pOpaque, mz_uint flags) {
  int status = TINFL_STATUS_DONE;
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
  mz_uint file_crc32 = MZ_CRC32_INIT;
#endif
  mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining,
                           out_buf_ofs = 0, cur_file_ofs;
  mz_zip_archive_file_stat file_stat;
  void *pRead_buf = NULL;
  void *pWrite_buf = NULL;
  mz_uint32
      local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) /
                       sizeof(mz_uint32)];
  mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

  if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
    return MZ_FALSE;

  /* A directory or zero length file */
  if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
    return MZ_TRUE;

  /* Encryption and patch files are not supported. */
  if (file_stat.m_bit_flag &
      (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION |
       MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

  /* This function only supports decompressing stored and deflate. */
  if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) &&
      (file_stat.m_method != MZ_DEFLATED))
    return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

  /* Read and do some minimal validation of the local directory entry (this
   * doesn't crack the zip64 stuff, which we already have from the central dir)
   */
  cur_file_ofs = file_stat.m_local_header_ofs;
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header,
                    MZ_ZIP_LOCAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
    return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

  if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  cur_file_ofs += (mz_uint64)(MZ_ZIP_LOCAL_DIR_HEADER_SIZE) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) +
                  MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
  if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

  /* Decompress the file either directly from memory or from a file input
   * buffer. */
  if (pZip->m_pState->m_pMem) {
    pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
    read_buf_size = read_buf_avail = file_stat.m_comp_size;
    comp_remaining = 0;
  } else {
    read_buf_size =
        MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
    if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                            (size_t)read_buf_size)))
      return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    read_buf_avail = 0;
    comp_remaining = file_stat.m_comp_size;
  }

  if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method)) {
    /* The file is stored or the caller has requested the compressed data. */
    if (pZip->m_pState->m_pMem) {
      if (((sizeof(size_t) == sizeof(mz_uint32))) &&
          (file_stat.m_comp_size > MZ_UINT32_MAX))
        return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

      if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                    (size_t)file_stat.m_comp_size) != file_stat.m_comp_size) {
        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
        status = TINFL_STATUS_FAILED;
      } else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        file_crc32 =
            (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf,
                                (size_t)file_stat.m_comp_size);
#endif
      }

      cur_file_ofs += file_stat.m_comp_size;
      out_buf_ofs += file_stat.m_comp_size;
      comp_remaining = 0;
    } else {
      while (comp_remaining) {
        read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
        if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                          (size_t)read_buf_avail) != read_buf_avail) {
          mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
          status = TINFL_STATUS_FAILED;
          break;
        }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) {
          file_crc32 = (mz_uint32)mz_crc32(
              file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);
        }
#endif

        if (pCallback(pOpaque, out_buf_ofs, pRead_buf,
                      (size_t)read_buf_avail) != read_buf_avail) {
          mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
          status = TINFL_STATUS_FAILED;
          break;
        }

        cur_file_ofs += read_buf_avail;
        out_buf_ofs += read_buf_avail;
        comp_remaining -= read_buf_avail;
      }
    }
  } else {
    tinfl_decompressor inflator;
    tinfl_init(&inflator);

    if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1,
                                             TINFL_LZ_DICT_SIZE))) {
      mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
      status = TINFL_STATUS_FAILED;
    } else {
      do {
        mz_uint8 *pWrite_buf_cur =
            (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        size_t in_buf_size,
            out_buf_size =
                TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
        if ((!read_buf_avail) && (!pZip->m_pState->m_pMem)) {
          read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
          if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf,
                            (size_t)read_buf_avail) != read_buf_avail) {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }
          cur_file_ofs += read_buf_avail;
          comp_remaining -= read_buf_avail;
          read_buf_ofs = 0;
        }

        in_buf_size = (size_t)read_buf_avail;
        status = tinfl_decompress(
            &inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size,
            (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size,
            comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
        read_buf_avail -= in_buf_size;
        read_buf_ofs += in_buf_size;

        if (out_buf_size) {
          if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) !=
              out_buf_size) {
            mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
          file_crc32 =
              (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
          if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size) {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
            break;
          }
        }
      } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) ||
               (status == TINFL_STATUS_HAS_MORE_OUTPUT));
    }
  }

  if ((status == TINFL_STATUS_DONE) &&
      (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))) {
    /* Make sure the entire file was decompressed, and check its CRC. */
    if (out_buf_ofs != file_stat.m_uncomp_size) {
      mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
      status = TINFL_STATUS_FAILED;
    }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
    else if (file_crc32 != file_stat.m_crc32) {
      mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
      status = TINFL_STATUS_FAILED;
    }
#endif
  }

  if (!pZip->m_pState->m_pMem)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

  if (pWrite_buf)
    pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

  return status == TINFL_STATUS_DONE;
}